

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket_server.c
# Opt level: O0

void apx_socketServer_create(apx_socketServer_t *self,apx_server_tag *apx_server)

{
  apx_server_tag *apx_server_local;
  apx_socketServer_t *self_local;
  
  if (self != (apx_socketServer_t *)0x0) {
    self->parent = apx_server;
    self->tcp_port = 0;
    self->unix_server_file = (char *)0x0;
    self->is_tcp_server_started = false;
    self->is_unix_server_started = false;
    self->tcp_connection_tag = (char *)0x0;
    self->unix_connection_tag = (char *)0x0;
  }
  return;
}

Assistant:

void apx_socketServer_create(apx_socketServer_t *self, struct apx_server_tag *apx_server)
{
   if (self != 0)
   {
      self->parent = apx_server;
      self->tcp_port = 0u;
      self->unix_server_file = (char*) 0;
      self->is_tcp_server_started = false;
      self->is_unix_server_started = false;
      self->tcp_connection_tag = (char*) 0;
      self->unix_connection_tag = (char*) 0;
   }
}